

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes Lzma2Dec_DecodeToDic
               (CLzma2Dec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  bool bVar1;
  SizeT SVar2;
  ELzma2State EVar3;
  uint uVar4;
  uint initDic_00;
  SRes SVar5;
  long lVar6;
  undefined4 uVar7;
  int __result__;
  Bool initState;
  Bool initDic_1;
  uint mode;
  SRes res;
  SizeT outSizeProcessed;
  Bool initDic;
  ELzmaFinishMode curFinishMode;
  SizeT srcSizeCur;
  SizeT destSizeCur;
  SizeT dicPos;
  SizeT inSize;
  ELzmaStatus *status_local;
  SizeT *pSStack_30;
  ELzmaFinishMode finishMode_local;
  SizeT *srcLen_local;
  Byte *src_local;
  SizeT dicLimit_local;
  CLzma2Dec *p_local;
  
  dicPos = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  inSize = (SizeT)status;
  status_local._4_4_ = finishMode;
  pSStack_30 = srcLen;
  srcLen_local = (SizeT *)src;
  src_local = (Byte *)dicLimit;
  dicLimit_local = (SizeT)p;
  while( true ) {
    while( true ) {
      while( true ) {
        if (*(int *)(dicLimit_local + 0x90) == 8) {
          *(undefined4 *)inSize = 1;
          return 0;
        }
        destSizeCur = *(SizeT *)(dicLimit_local + 0x30);
        if (*(int *)(dicLimit_local + 0x90) == 9) {
          return 1;
        }
        if (((Byte *)destSizeCur == src_local) && (status_local._4_4_ == LZMA_FINISH_ANY)) {
          *(undefined4 *)inSize = 2;
          return 0;
        }
        if ((*(int *)(dicLimit_local + 0x90) == 6) || (*(int *)(dicLimit_local + 0x90) == 7)) break;
        if (*pSStack_30 == dicPos) {
          *(undefined4 *)inSize = 3;
          return 0;
        }
        *pSStack_30 = *pSStack_30 + 1;
        SVar2 = *srcLen_local;
        srcLen_local = (SizeT *)((long)srcLen_local + 1);
        EVar3 = Lzma2Dec_UpdateState((CLzma2Dec *)dicLimit_local,(Byte)SVar2);
        *(ELzma2State *)(dicLimit_local + 0x90) = EVar3;
        if (((Byte *)destSizeCur == src_local) && (*(int *)(dicLimit_local + 0x90) != 8)) {
          *(undefined4 *)(dicLimit_local + 0x90) = 9;
          return 1;
        }
      }
      srcSizeCur = (long)src_local - destSizeCur;
      _initDic = dicPos - *pSStack_30;
      bVar1 = *(uint *)(dicLimit_local + 0x8c) <= srcSizeCur;
      if (bVar1) {
        srcSizeCur = (SizeT)*(uint *)(dicLimit_local + 0x8c);
      }
      outSizeProcessed._4_4_ = (ELzmaFinishMode)bVar1;
      if ((*(byte *)(dicLimit_local + 0x94) & 0x80) != 0) break;
      if (*pSStack_30 == dicPos) {
        *(undefined4 *)inSize = 3;
        return 0;
      }
      if (*(int *)(dicLimit_local + 0x90) == 6) {
        uVar4 = (uint)(*(char *)(dicLimit_local + 0x94) == '\x01');
        if (uVar4 == 0) {
          if (*(int *)(dicLimit_local + 0x98) != 0) {
            *(undefined4 *)(dicLimit_local + 0x90) = 9;
            return 1;
          }
        }
        else {
          *(undefined4 *)(dicLimit_local + 0x9c) = 1;
          *(undefined4 *)(dicLimit_local + 0xa0) = 1;
        }
        *(undefined4 *)(dicLimit_local + 0x98) = 0;
        LzmaDec_InitDicAndState((CLzmaDec *)dicLimit_local,uVar4,0);
      }
      if (srcSizeCur < _initDic) {
        _initDic = srcSizeCur;
      }
      if (_initDic == 0) {
        *(undefined4 *)(dicLimit_local + 0x90) = 9;
        return 1;
      }
      LzmaDec_UpdateWithUncompressed((CLzmaDec *)dicLimit_local,(Byte *)srcLen_local,_initDic);
      srcLen_local = (SizeT *)(_initDic + (long)srcLen_local);
      *pSStack_30 = _initDic + *pSStack_30;
      *(int *)(dicLimit_local + 0x8c) = *(int *)(dicLimit_local + 0x8c) - (int)_initDic;
      uVar7 = 7;
      if (*(int *)(dicLimit_local + 0x8c) == 0) {
        uVar7 = 0;
      }
      *(undefined4 *)(dicLimit_local + 0x90) = uVar7;
    }
    if (*(int *)(dicLimit_local + 0x90) == 6) {
      uVar4 = (int)(uint)*(byte *)(dicLimit_local + 0x94) >> 5 & 3;
      initDic_00 = (uint)(uVar4 == 3);
      uVar4 = (uint)(uVar4 != 0);
      if (((initDic_00 == 0) && (*(int *)(dicLimit_local + 0x98) != 0)) ||
         ((uVar4 == 0 && (*(int *)(dicLimit_local + 0x9c) != 0)))) {
        *(undefined4 *)(dicLimit_local + 0x90) = 9;
        return 1;
      }
      LzmaDec_InitDicAndState((CLzmaDec *)dicLimit_local,initDic_00,uVar4);
      *(undefined4 *)(dicLimit_local + 0x98) = 0;
      *(undefined4 *)(dicLimit_local + 0x9c) = 0;
      *(undefined4 *)(dicLimit_local + 0x90) = 7;
    }
    if (*(uint *)(dicLimit_local + 0x88) < _initDic) {
      _initDic = (ulong)*(uint *)(dicLimit_local + 0x88);
    }
    SVar5 = LzmaDec_DecodeToDic((CLzmaDec *)dicLimit_local,destSizeCur + srcSizeCur,
                                (Byte *)srcLen_local,(SizeT *)&initDic,outSizeProcessed._4_4_,
                                (ELzmaStatus *)inSize);
    srcLen_local = (SizeT *)(_initDic + (long)srcLen_local);
    *pSStack_30 = _initDic + *pSStack_30;
    *(int *)(dicLimit_local + 0x88) = *(int *)(dicLimit_local + 0x88) - (int)_initDic;
    lVar6 = *(long *)(dicLimit_local + 0x30) - destSizeCur;
    *(int *)(dicLimit_local + 0x8c) = *(int *)(dicLimit_local + 0x8c) - (int)lVar6;
    if (SVar5 != 0) break;
    if (*(int *)inSize == 3) {
      return 0;
    }
    if ((_initDic == 0) && (lVar6 == 0)) {
      if ((*(int *)inSize != 4) ||
         ((*(int *)(dicLimit_local + 0x8c) != 0 || (*(int *)(dicLimit_local + 0x88) != 0)))) {
        *(undefined4 *)(dicLimit_local + 0x90) = 9;
        return 1;
      }
      *(undefined4 *)(dicLimit_local + 0x90) = 0;
    }
    if (*(int *)inSize == 4) {
      *(undefined4 *)inSize = 2;
    }
  }
  return SVar5;
}

Assistant:

static SRes Lzma2Dec_DecodeToDic(CLzma2Dec *p, SizeT dicLimit,
    const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->state != LZMA2_STATE_FINISHED)
  {
    SizeT dicPos = p->decoder.dicPos;
    
    if (p->state == LZMA2_STATE_ERROR)
      return SZ_ERROR_DATA;
    
    if (dicPos == dicLimit && finishMode == LZMA_FINISH_ANY)
    {
      *status = LZMA_STATUS_NOT_FINISHED;
      return SZ_OK;
    }

    if (p->state != LZMA2_STATE_DATA && p->state != LZMA2_STATE_DATA_CONT)
    {
      if (*srcLen == inSize)
      {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      (*srcLen)++;
      p->state = Lzma2Dec_UpdateState(p, *src++);

      if (dicPos == dicLimit && p->state != LZMA2_STATE_FINISHED)
      {
        p->state = LZMA2_STATE_ERROR;
        return SZ_ERROR_DATA;
      }
      continue;
    }
    
    {
      SizeT destSizeCur = dicLimit - dicPos;
      SizeT srcSizeCur = inSize - *srcLen;
      ELzmaFinishMode curFinishMode = LZMA_FINISH_ANY;
      
      if (p->unpackSize <= destSizeCur)
      {
        destSizeCur = (SizeT)p->unpackSize;
        curFinishMode = LZMA_FINISH_END;
      }

      if (LZMA2_IS_UNCOMPRESSED_STATE(p))
      {
        if (*srcLen == inSize)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }

        if (p->state == LZMA2_STATE_DATA)
        {
          Bool initDic = (p->control == LZMA2_CONTROL_COPY_RESET_DIC);
          if (initDic)
            p->needInitProp = p->needInitState = True;
          else if (p->needInitDic)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->needInitDic = False;
          LzmaDec_InitDicAndState(&p->decoder, initDic, False);
        }

        if (srcSizeCur > destSizeCur)
          srcSizeCur = destSizeCur;

        if (srcSizeCur == 0)
        {
          p->state = LZMA2_STATE_ERROR;
          return SZ_ERROR_DATA;
        }

        LzmaDec_UpdateWithUncompressed(&p->decoder, src, srcSizeCur);

        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->unpackSize -= (UInt32)srcSizeCur;
        p->state = (p->unpackSize == 0) ? LZMA2_STATE_CONTROL : LZMA2_STATE_DATA_CONT;
      }
      else
      {
        SizeT outSizeProcessed;
        SRes res;

        if (p->state == LZMA2_STATE_DATA)
        {
          unsigned mode = LZMA2_GET_LZMA_MODE(p);
          Bool initDic = (mode == 3);
          Bool initState = (mode != 0);
          if ((!initDic && p->needInitDic) || (!initState && p->needInitState))
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          
          LzmaDec_InitDicAndState(&p->decoder, initDic, initState);
          p->needInitDic = False;
          p->needInitState = False;
          p->state = LZMA2_STATE_DATA_CONT;
        }
  
        if (srcSizeCur > p->packSize)
          srcSizeCur = (SizeT)p->packSize;
          
        res = LzmaDec_DecodeToDic(&p->decoder, dicPos + destSizeCur, src, &srcSizeCur, curFinishMode, status);
        
        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->packSize -= (UInt32)srcSizeCur;

        outSizeProcessed = p->decoder.dicPos - dicPos;
        p->unpackSize -= (UInt32)outSizeProcessed;

        RINOK(res);
        if (*status == LZMA_STATUS_NEEDS_MORE_INPUT)
          return res;

        if (srcSizeCur == 0 && outSizeProcessed == 0)
        {
          if (*status != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK
              || p->unpackSize != 0
              || p->packSize != 0)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->state = LZMA2_STATE_CONTROL;
        }
        
        if (*status == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK)
          *status = LZMA_STATUS_NOT_FINISHED;
      }
    }
  }
  
  *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return SZ_OK;
}